

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O1

int uv__async_fork(uv_loop_t *loop)

{
  int iVar1;
  uv__queue *q_00;
  uv_async_t *h;
  uv__queue *q;
  uv__queue queue;
  uv_loop_t *loop_local;
  
  if ((loop->async_io_watcher).fd == -1) {
    loop_local._4_4_ = 0;
  }
  else {
    queue.prev = (uv__queue *)loop;
    uv__queue_move(&loop->async_handles,(uv__queue *)&q);
    while( true ) {
      iVar1 = uv__queue_empty((uv__queue *)&q);
      if (iVar1 != 0) break;
      q_00 = uv__queue_head((uv__queue *)&q);
      uv__queue_remove(q_00);
      uv__queue_insert_tail(queue.prev + 0x1b,q_00);
      *(undefined4 *)&q_00[1].next = 0;
      *(undefined4 *)&q_00[-4].prev = 0;
    }
    if (*(int *)&queue.prev[0x20].next != -1) {
      if (*(int *)&queue.prev[0x20].next != *(int *)&queue.prev[0x1f].prev) {
        uv__close(*(int *)&queue.prev[0x20].next);
      }
      *(undefined4 *)&queue.prev[0x20].next = 0xffffffff;
    }
    uv__io_stop((uv_loop_t *)queue.prev,(uv__io_t *)&queue.prev[0x1c].prev,1);
    uv__close(*(int *)&queue.prev[0x1f].prev);
    *(undefined4 *)&queue.prev[0x1f].prev = 0xffffffff;
    loop_local._4_4_ = uv__async_start((uv_loop_t *)queue.prev);
  }
  return loop_local._4_4_;
}

Assistant:

int uv__async_fork(uv_loop_t* loop) {
  struct uv__queue queue;
  struct uv__queue* q;
  uv_async_t* h;

  if (loop->async_io_watcher.fd == -1) /* never started */
    return 0;

  uv__queue_move(&loop->async_handles, &queue);
  while (!uv__queue_empty(&queue)) {
    q = uv__queue_head(&queue);
    h = uv__queue_data(q, uv_async_t, queue);

    uv__queue_remove(q);
    uv__queue_insert_tail(&loop->async_handles, q);

    /* The state of any thread that set pending is now likely corrupt in this
     * child because the user called fork, so just clear these flags and move
     * on. Calling most libc functions after `fork` is declared to be undefined
     * behavior anyways, unless async-signal-safe, for multithreaded programs
     * like libuv, and nothing interesting in pthreads is async-signal-safe.
     */
    h->pending = 0;
    /* This is the busy flag, and we just abruptly lost all other threads. */
    h->u.fd = 0;
  }

  /* Recreate these, since they still exist, but belong to the wrong pid now. */
  if (loop->async_wfd != -1) {
    if (loop->async_wfd != loop->async_io_watcher.fd)
      uv__close(loop->async_wfd);
    loop->async_wfd = -1;
  }

  uv__io_stop(loop, &loop->async_io_watcher, POLLIN);
  uv__close(loop->async_io_watcher.fd);
  loop->async_io_watcher.fd = -1;

  return uv__async_start(loop);
}